

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

CharFormat testing::internal::PrintAsWideStringLiteralTo(wchar_t c,ostream *os)

{
  CharFormat CVar1;
  
  if (c == L'\"') {
    std::operator<<(os,"\\\"");
    CVar1 = kSpecialEscape;
  }
  else {
    if (c != L'\'') {
      CVar1 = PrintAsCharLiteralTo<wchar_t,wchar_t>(c,os);
      return CVar1;
    }
    std::operator<<(os,"\'");
    CVar1 = kAsIs;
  }
  return CVar1;
}

Assistant:

static CharFormat PrintAsWideStringLiteralTo(wchar_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo<wchar_t>(c, os);
  }
}